

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O2

BufferBlock * __thiscall
cppnet::AlloterWrap::PoolNew<cppnet::BufferBlock,std::shared_ptr<cppnet::BlockMemoryPool>&>
          (AlloterWrap *this,shared_ptr<cppnet::BlockMemoryPool> *args)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  BufferBlock *this_00;
  
  peVar1 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_Alloter[3])(peVar1,0x70);
  this_00 = (BufferBlock *)CONCAT44(extraout_var,iVar2);
  if (this_00 != (BufferBlock *)0x0) {
    BufferBlock::BufferBlock(this_00,args);
  }
  return this_00;
}

Assistant:

T* AlloterWrap::PoolNew(Args&&... args) {
    uint32_t sz = sizeof(T);
    
    void* data = _alloter->MallocAlign(sz);
    if (!data) {
        return nullptr;
    }

    T* res = new(data) T(std::forward<Args>(args)...);
    return res;
}